

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgn.h
# Opt level: O3

bool __thiscall pgn::find_move<(Piece)1>(pgn *this,position *p,Square *to,Move *m,int row,int col)

{
  Square *pSVar1;
  U8 UVar2;
  byte bVar3;
  Square SVar4;
  bool bVar5;
  int iVar6;
  byte bVar7;
  Square *pSVar8;
  U8 *pUVar9;
  ulong uVar10;
  ulong uVar11;
  Move *m_00;
  long lVar12;
  Movegen mvs;
  Movegen local_3a8;
  
  Movegen::Movegen(&local_3a8,p);
  SVar4 = *local_3a8.knights;
  iVar6 = local_3a8.last;
  pSVar8 = local_3a8.knights;
  while (SVar4 != no_square) {
    uVar10 = (&bitboards::nmask)[SVar4];
    uVar11 = uVar10 & local_3a8.qtarget;
    if (uVar11 != 0) {
      pUVar9 = &local_3a8.list[iVar6].type;
      do {
        lVar12 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
          }
        }
        ((Move *)(pUVar9 + -2))->f = (U8)SVar4;
        pUVar9[-1] = (U8)lVar12;
        *pUVar9 = '\n';
        pUVar9 = pUVar9 + 3;
        iVar6 = iVar6 + 1;
        uVar11 = uVar11 & uVar11 - 1;
        local_3a8.last = iVar6;
      } while (uVar11 != 0);
    }
    uVar10 = uVar10 & local_3a8.ctarget;
    if (uVar10 != 0) {
      pUVar9 = &local_3a8.list[iVar6].type;
      do {
        lVar12 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
          }
        }
        ((Move *)(pUVar9 + -2))->f = (U8)SVar4;
        pUVar9[-1] = (U8)lVar12;
        *pUVar9 = '\v';
        pUVar9 = pUVar9 + 3;
        iVar6 = iVar6 + 1;
        uVar10 = uVar10 & uVar10 - 1;
        local_3a8.last = iVar6;
      } while (uVar10 != 0);
    }
    pSVar1 = pSVar8 + 1;
    pSVar8 = pSVar8 + 1;
    SVar4 = *pSVar1;
  }
  if (0 < iVar6) {
    UVar2 = m->type;
    m_00 = local_3a8.list;
    lVar12 = 0;
    do {
      bVar5 = position::is_legal(p,m_00);
      if (bVar5) {
        if (UVar2 == '\x11') {
          bVar3 = m_00->t;
          if (*to == (uint)bVar3) {
            if (((row < 0) || (bVar7 = m_00->f, (uint)(bVar7 >> 3) != row)) &&
               ((col < 0 || (bVar7 = m_00->f, (bVar7 & 7) != col)))) {
              if (-1 < (col & row)) goto LAB_0011e048;
              m->f = m_00->f;
            }
            else {
              m->f = bVar7;
            }
            m->t = bVar3;
            m->type = m_00->type;
LAB_0011e0b4:
            bVar5 = true;
            goto LAB_0011e05f;
          }
        }
        else if ((m->type == m_00->type) && (bVar3 = m_00->t, *to == (uint)bVar3)) {
          if (((row < 0) || (bVar7 = m_00->f, (uint)(bVar7 >> 3) != row)) &&
             ((col < 0 || (bVar7 = m_00->f, (bVar7 & 7) != col)))) {
            if (-1 < (col & row)) goto LAB_0011e048;
            m->f = m_00->f;
          }
          else {
            m->f = bVar7;
          }
          m->t = bVar3;
          goto LAB_0011e0b4;
        }
      }
LAB_0011e048:
      lVar12 = lVar12 + 1;
      m_00 = m_00 + 1;
    } while (lVar12 < local_3a8.last);
  }
  bVar5 = false;
LAB_0011e05f:
  Movegen::~Movegen(&local_3a8);
  return bVar5;
}

Assistant:

bool pgn::find_move(position& p, const Square& to, Move& m, int row, int col) {

	Movegen mvs(p);
	mvs.generate<piece>();
	bool promotion = (m.type != Movetype::no_type);


	for (int j = 0; j < mvs.size(); ++j) {

		if (!p.is_legal(mvs[j])) continue;

		if (promotion && m.type == mvs[j].type && mvs[j].t == to) {

			if (row >= 0 && row == util::row(mvs[j].f)) { m = mvs[j]; return true; }
			if (col >= 0 && col == util::col(mvs[j].f)) { m = mvs[j]; return true; }
			if (col < 0 && row < 0) { m = mvs[j]; return true; }
		}

		else if (!promotion && mvs[j].t == to) {
			if (row >= 0 && row == util::row(mvs[j].f)) { m = mvs[j]; return true; }
			if (col >= 0 && col == util::col(mvs[j].f)) { m = mvs[j]; return true; }
			if (col < 0 && row < 0) { m = mvs[j]; return true; }
		}

	}
	return false;
}